

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ObjMffcLabel_rec(Nwk_Obj_t *pNode,int fTopmost)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Nwk_Obj_t *pNStack_20;
  int i;
  Nwk_Obj_t *pFanin;
  int fTopmost_local;
  Nwk_Obj_t *pNode_local;
  
  if (((fTopmost != 0) || ((iVar1 = Nwk_ObjIsCi(pNode), iVar1 == 0 && (pNode->nFanouts < 1)))) &&
     (iVar1 = Nwk_ObjIsTravIdCurrent(pNode), iVar1 == 0)) {
    Nwk_ObjSetTravIdCurrent(pNode);
    local_24 = 0;
    while( true ) {
      bVar2 = false;
      if (local_24 < pNode->nFanins) {
        pNStack_20 = pNode->pFanio[local_24];
        bVar2 = pNStack_20 != (Nwk_Obj_t *)0x0;
      }
      if (!bVar2) break;
      Nwk_ObjMffcLabel_rec(pNStack_20,0);
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void Nwk_ObjMffcLabel_rec( Nwk_Obj_t * pNode, int fTopmost )
{
    Nwk_Obj_t * pFanin;
    int i;
    // add to the new support nodes
    if ( !fTopmost && (Nwk_ObjIsCi(pNode) || pNode->nFanouts > 0) )
        return;
    // skip visited nodes
    if ( Nwk_ObjIsTravIdCurrent(pNode) )
        return;
    Nwk_ObjSetTravIdCurrent(pNode);
    // recur on the children
    Nwk_ObjForEachFanin( pNode, pFanin, i )
        Nwk_ObjMffcLabel_rec( pFanin, 0 );
    // collect the internal node
//    printf( "%d ", pNode->Id );
}